

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O0

void __thiscall MxxReduce_GlobalReduce_Test::TestBody(MxxReduce_GlobalReduce_Test *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  reference pvVar4;
  char *message;
  AssertHelper local_b8;
  Message local_b0;
  int local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  int num_els;
  int nonzero_size;
  long totalsum;
  size_t i;
  undefined1 local_68 [8];
  vector<long,_std::allocator<long>_> local;
  int local_3c;
  size_type sStack_38;
  int presize;
  size_t n;
  comm c;
  MxxReduce_GlobalReduce_Test *this_local;
  
  c._24_8_ = this;
  mxx::comm::comm((comm *)&n);
  sStack_38 = 0;
  local_3c = 0;
  iVar2 = mxx::comm::rank((comm *)&n);
  if (iVar2 % 2 == 0) {
    iVar2 = mxx::comm::rank((comm *)&n);
    sStack_38 = (size_type)(iVar2 / 2 + 1);
    local_3c = (int)(sStack_38 * (sStack_38 - 1) >> 1);
  }
  std::allocator<long>::allocator((allocator<long> *)((long)&i + 7));
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_68,sStack_38,
             (allocator<long> *)((long)&i + 7));
  std::allocator<long>::~allocator((allocator<long> *)((long)&i + 7));
  for (totalsum = 0; (ulong)totalsum < sStack_38; totalsum = totalsum + 1) {
    lVar3 = local_3c + totalsum;
    pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_68,totalsum);
    *pvVar4 = lVar3 + 1;
  }
  _nonzero_size = mxx::global_reduce<long,MxxReduce_GlobalReduce_Test::TestBody()::__0>(local_68,&n)
  ;
  iVar2 = mxx::comm::size((comm *)&n);
  iVar2 = (iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1;
  gtest_ar.message_.ptr_._4_4_ = (iVar2 * (iVar2 + 1)) / 2;
  local_a4 = (gtest_ar.message_.ptr_._4_4_ * (gtest_ar.message_.ptr_._4_4_ + 1)) / 2;
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_a0,"num_els*(num_els+1)/2","totalsum",&local_a4,
             (long *)&nonzero_size);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0xf5,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_68)
  ;
  mxx::comm::~comm((comm *)&n);
  return;
}

Assistant:

TEST(MxxReduce, GlobalReduce) {
    mxx::comm c;

    // test reduce with zero elements for some processes
    size_t n = 0;
    int presize = 0;
    if (c.rank() % 2 == 0) {
        n = (c.rank()/2+1);
        presize = n*(n-1)/2;
    }
    std::vector<long> local(n);
    for (size_t i = 0; i < n; ++i) {
        local[i] = presize + i + 1;
    }
    long totalsum = mxx::global_reduce(local, [](int x, int y){ return x+y; }, c);
    int nonzero_size = (c.size()+1)/2;
    int num_els = nonzero_size*(nonzero_size+1)/2;
    ASSERT_EQ(num_els*(num_els+1)/2, totalsum);
}